

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

Var __thiscall Js::JavascriptStackWalker::GetThisFromFrame(JavascriptStackWalker *this)

{
  ushort uVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptFunction *pJVar6;
  void **ppvVar7;
  JavascriptGenerator *pJVar8;
  Var pvVar9;
  
  uVar1 = *(ushort *)&this->field_0x50;
  if ((uVar1 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45b,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
    if (!bVar4) goto LAB_00aec657;
    *puVar5 = 0;
    uVar1 = *(ushort *)&this->field_0x50;
  }
  if (((uVar1 >> 2 | uVar1) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45c,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar4) {
LAB_00aec657:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pJVar6 = GetCurrentFunction(this,true);
  TVar2 = ((pJVar6->functionInfo).ptr)->attributes;
  ppvVar7 = GetCurrentArgv(this);
  if ((TVar2 & (Async|Generator)) != None) {
    pJVar8 = VarTo<Js::JavascriptGenerator>(ppvVar7[2]);
    pvVar9 = Arguments::operator[](&pJVar8->args,0);
    return pvVar9;
  }
  return ppvVar7[2];
}

Assistant:

Var JavascriptStackWalker::GetThisFromFrame() const
    {
        Assert(!inlinedFramesBeingWalked);
        Assert(this->IsJavascriptFrame());

        if (this->GetCurrentFunction()->GetFunctionInfo()->IsCoroutine())
        {
            JavascriptGenerator* gen = VarTo<JavascriptGenerator>(this->GetCurrentArgv()[JavascriptFunctionArgIndex_This]);
            return gen->GetArguments()[0];
        }

        return this->GetCurrentArgv()[JavascriptFunctionArgIndex_This];
    }